

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_channels(exr_context_t ctxt,int part_index,exr_attr_chlist_t *channels)

{
  long lVar1;
  undefined8 *puVar2;
  exr_result_t eVar3;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  exr_attr_chlist_t clist;
  exr_priv_part_t part;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_const_context_t in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined8 local_40;
  exr_attr_chlist_t *srcchl;
  uint in_stack_ffffffffffffffd0;
  exr_context_t ctxt_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDX == 0) {
    eVar3 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"No channels provided for channel list");
  }
  else {
    eVar3 = 0;
    if (in_RDI == (char *)0x0) {
      eVar3 = 2;
    }
    else {
      internal_exr_lock(in_stack_ffffffffffffffb0);
      if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
        internal_exr_unlock(in_stack_ffffffffffffffb0);
        eVar3 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
      }
      else {
        srcchl = *(exr_attr_chlist_t **)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
        if (*in_RDI == '\0') {
          internal_exr_unlock(in_stack_ffffffffffffffb0);
          eVar3 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
        }
        else if (*in_RDI == '\x03') {
          internal_exr_unlock(in_stack_ffffffffffffffb0);
          eVar3 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
        }
        else {
          lVar1._0_4_ = srcchl[2].num_channels;
          lVar1._4_4_ = srcchl[2].num_alloced;
          if (lVar1 == 0) {
            eVar3 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                      (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8),
                                      (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                                      (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      (exr_attribute_t **)part);
          }
          else if (*(int *)(*(long *)(srcchl + 2) + 0x14) != 3) {
            internal_exr_unlock(in_stack_ffffffffffffffb0);
            eVar3 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               *(undefined8 *)(*(long *)(srcchl + 2) + 8),"channels");
            return eVar3;
          }
          ctxt_00 = *(exr_context_t *)(srcchl + 2);
          if (eVar3 == 0) {
            eVar3 = exr_attr_chlist_duplicate
                              (ctxt_00,(exr_attr_chlist_t *)(ulong)in_stack_ffffffffffffffd0,srcchl)
            ;
            if (eVar3 != 0) {
              internal_exr_unlock(in_stack_ffffffffffffffb0);
              return eVar3;
            }
            exr_attr_chlist_destroy(ctxt_00,(exr_attr_chlist_t *)(ulong)in_stack_ffffffffffffffd0);
            puVar2 = *(undefined8 **)&ctxt_00->tmp_filename;
            *puVar2 = local_48;
            puVar2[1] = local_40;
          }
          internal_exr_unlock(in_stack_ffffffffffffffb0);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_set_channels (
    exr_context_t ctxt, int part_index, const exr_attr_chlist_t* channels)
{
    if (!channels)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No channels provided for channel list");

    {
        REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
        if (rv == EXR_ERR_SUCCESS)
        {
            exr_attr_chlist_t clist;

            rv = exr_attr_chlist_duplicate (ctxt, &clist, channels);
            if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN (rv);

            exr_attr_chlist_destroy (ctxt, attr->chlist);
            *(attr->chlist) = clist;
        }
        return EXR_UNLOCK_AND_RETURN (rv);
    }
}